

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O2

bool deqp::gles2::Functional::compareToConstantColor
               (TestLog *log,char *imageSetName,char *imageSetDesc,Surface *result,
               CompareLogMode logMode,RGBA color)

{
  ostringstream *this;
  uint uVar1;
  ulong __n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  allocator<char> local_26c;
  allocator<char> local_26b;
  allocator<char> local_26a;
  allocator<char> local_269;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  LogImageSet local_1e8;
  undefined1 local_1a8 [384];
  
  uVar1 = *(uint *)imageSetName;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  __n = (ulong)*(uint *)(imageSetName + 4);
  if ((int)*(uint *)(imageSetName + 4) < 1) {
    __n = uVar4;
  }
  bVar2 = true;
  for (iVar6 = 0; iVar6 != (int)__n; iVar6 = iVar6 + 1) {
    iVar3 = (int)uVar4;
    uVar7 = uVar5;
    while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
      bVar2 = (bool)(bVar2 & *(int *)(*(long *)(imageSetName + 8) + (long)(int)uVar4 * 4) ==
                             (int)imageSetDesc);
      uVar4 = (ulong)((int)uVar4 + 1);
    }
    uVar4 = (ulong)(iVar3 + uVar1);
  }
  iVar6 = (int)log;
  if (bVar2 == false) {
    this = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"Image comparison failed");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"Result",&local_269);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"Image comparison result",&local_26a);
    tcu::LogImageSet::LogImageSet(&local_1e8,&local_208,&local_228);
    tcu::LogImageSet::write(&local_1e8,iVar6,__buf_01,__n);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"Result",&local_26b);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"Result",&local_26c);
    tcu::LogImage::LogImage
              ((LogImage *)local_1a8,&local_248,&local_268,(Surface *)imageSetName,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1a8,iVar6,__buf_02,(size_t)imageSetName);
    tcu::TestLog::endImageSet(log);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"Result",&local_269);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"Image comparison result",&local_26a);
    tcu::LogImageSet::LogImageSet(&local_1e8,&local_208,&local_228);
    tcu::LogImageSet::write(&local_1e8,iVar6,__buf,__n);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"Result",&local_26b);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"Result",&local_26c);
    tcu::LogImage::LogImage
              ((LogImage *)local_1a8,&local_248,&local_268,(Surface *)imageSetName,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1a8,iVar6,__buf_00,(size_t)imageSetName);
    tcu::TestLog::endImageSet(log);
  }
  tcu::LogImage::~LogImage((LogImage *)local_1a8);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  tcu::LogImageSet::~LogImageSet(&local_1e8);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  return bVar2;
}

Assistant:

static bool compareToConstantColor (TestLog& log, const char* imageSetName, const char* imageSetDesc, const tcu::Surface& result, tcu::CompareLogMode logMode, RGBA color)
{
	bool isOk = true;

	for (int y = 0; y < result.getHeight(); y++)
	{
		for (int x = 0; x < result.getWidth(); x++)
		{
			if (result.getPixel(x, y).getRed()		!= color.getRed()	||
				result.getPixel(x, y).getGreen()	!= color.getGreen() ||
				result.getPixel(x, y).getBlue()		!= color.getBlue()	||
				result.getPixel(x, y).getAlpha()	!= color.getAlpha())
			{
				isOk = false;
			}
		}
	}

	if (!isOk || logMode == tcu::COMPARE_LOG_EVERYTHING)
	{
		if (!isOk)
			log << TestLog::Message << "Image comparison failed" << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result)
			<< TestLog::EndImageSet;
	}
	else if (logMode == tcu::COMPARE_LOG_RESULT)
		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result)
			<< TestLog::EndImageSet;

	return isOk;
}